

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O3

RK_S32 pred_weight_table(HEVCContext *s,BitReadCtx_t *gb)

{
  byte bVar1;
  RK_U32 RVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  RK_S16 RVar6;
  MPP_RET MVar7;
  uint uVar8;
  uint uVar9;
  HEVCSPS *pHVar10;
  short sVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  HEVCSPS *pHVar16;
  RK_S32 _out_9;
  RK_U8 luma_weight_l1_flag [16];
  RK_U8 luma_weight_l0_flag [16];
  RK_U8 chroma_weight_l1_flag [16];
  RK_U8 chroma_weight_l0_flag [16];
  RK_U32 local_a4;
  HEVCSPS *local_a0;
  int local_98 [4];
  RK_S16 (*local_88) [2];
  RK_S16 (*local_80) [2];
  RK_S16 (*local_78) [2];
  RK_S16 (*local_70) [2];
  RK_U32 local_68 [4];
  RK_S32 local_58 [4];
  RK_S32 local_48 [6];
  
  MVar7 = mpp_read_ue(gb,local_68);
  pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
  gb->ret = MVar7;
  if (MVar7 != MPP_OK) goto LAB_0019f55c;
  (s->sh).luma_log2_weight_denom = (RK_U8)local_68[0];
  pHVar10 = s->sps;
  if (pHVar10->chroma_format_idc != 0) {
    MVar7 = mpp_read_se(gb,(RK_S32 *)local_68);
    pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
    gb->ret = MVar7;
    if (MVar7 != MPP_OK) goto LAB_0019f55c;
    uVar8 = (s->sh).luma_log2_weight_denom + local_68[0];
    uVar9 = 7;
    if ((int)uVar8 < 7) {
      uVar9 = uVar8;
    }
    uVar8 = 0;
    if (0 < (int)uVar9) {
      uVar8 = uVar9;
    }
    pHVar10 = (HEVCSPS *)(ulong)uVar8;
    (s->sh).chroma_log2_weight_denom = (RK_S16)uVar8;
  }
  if ((s->sh).nb_refs[0] != 0) {
    uVar15 = 0;
    do {
      MVar7 = mpp_read_bits(gb,1,local_48);
      cVar4 = (char)local_48[0];
      pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
      gb->ret = MVar7;
      if (MVar7 != MPP_OK) goto LAB_0019f55c;
      *(char *)((long)local_68 + uVar15) = (char)local_48[0];
      if (cVar4 == '\0') {
        (s->sh).luma_weight_l0[uVar15] = (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
        (s->sh).luma_offset_l0[uVar15] = 0;
      }
      uVar15 = uVar15 + 1;
      uVar12 = (ulong)(s->sh).nb_refs[0];
    } while (uVar15 < uVar12);
    pHVar10 = s->sps;
    if (pHVar10->chroma_format_idc == 0) {
      if (uVar12 != 0) {
        memset(local_48,0,uVar12);
LAB_0019f695:
        local_80 = (s->sh).chroma_weight_l0;
        local_88 = (s->sh).chroma_offset_l0;
        pHVar16 = (HEVCSPS *)0x0;
        do {
          if (*(char *)((long)local_68 + (long)pHVar16) != '\0') {
            MVar7 = mpp_read_se(gb,local_98);
            pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
            gb->ret = MVar7;
            if (MVar7 != MPP_OK) goto LAB_0019f55c;
            (s->sh).luma_weight_l0[(long)pHVar16] =
                 (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)local_98[0];
            MVar7 = mpp_read_se(gb,local_98);
            pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
            gb->ret = MVar7;
            if (MVar7 != MPP_OK) goto LAB_0019f55c;
            (s->sh).luma_offset_l0[(long)pHVar16] = (RK_S16)local_98[0];
          }
          local_a0 = pHVar16;
          if (*(char *)((long)local_48 + (long)pHVar16) == '\0') {
            RVar6 = (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
            (s->sh).chroma_weight_l0[(long)pHVar16][0] = RVar6;
            (s->sh).chroma_offset_l0[(long)pHVar16] = (RK_S16  [2])0x0;
            (s->sh).chroma_weight_l0[(long)pHVar16][1] = RVar6;
          }
          else {
            local_70 = local_80 + (long)pHVar16;
            local_78 = local_88 + (long)pHVar16;
            lVar13 = 0;
            bVar5 = true;
            do {
              bVar14 = bVar5;
              MVar7 = mpp_read_se(gb,local_98);
              iVar3 = local_98[0];
              pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
              gb->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_0019f55c;
              MVar7 = mpp_read_se(gb,local_98);
              pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
              gb->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_0019f55c;
              bVar1 = (byte)(s->sh).chroma_log2_weight_denom;
              sVar11 = (short)(1 << (bVar1 & 0x1f)) + (short)iVar3;
              (*local_70)[lVar13] = sVar11;
              uVar9 = local_98[0] - (((int)sVar11 << 7) >> (bVar1 & 0x1f));
              if (-2 < (int)uVar9) {
                uVar9 = 0xffffffff;
              }
              if (uVar9 < 0xffffff01) {
                uVar9 = 0xffffff00;
              }
              (*local_78)[lVar13] = (short)uVar9 + 0x80;
              lVar13 = 1;
              bVar5 = false;
            } while (bVar14);
          }
          pHVar16 = (HEVCSPS *)((long)&local_a0->vps_id + 1);
          pHVar10 = (HEVCSPS *)(ulong)(s->sh).nb_refs[0];
        } while (pHVar16 < pHVar10);
      }
    }
    else if (uVar12 != 0) {
      pHVar16 = (HEVCSPS *)0x0;
      do {
        MVar7 = mpp_read_bits(gb,1,local_98);
        pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
        gb->ret = MVar7;
        if (MVar7 != MPP_OK) goto LAB_0019f55c;
        *(undefined1 *)((long)local_48 + (long)pHVar16) = (undefined1)local_98[0];
        pHVar16 = (HEVCSPS *)((long)&pHVar16->vps_id + 1);
        uVar9 = (s->sh).nb_refs[0];
        pHVar10 = (HEVCSPS *)(ulong)uVar9;
      } while (pHVar16 < pHVar10);
      if (uVar9 != 0) goto LAB_0019f695;
    }
  }
  if (((s->sh).slice_type == B_SLICE) && ((s->sh).nb_refs[1] != 0)) {
    uVar15 = 0;
    do {
      MVar7 = mpp_read_bits(gb,1,local_58);
      cVar4 = (char)local_58[0];
      pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
      gb->ret = MVar7;
      if (MVar7 != MPP_OK) goto LAB_0019f55c;
      *(char *)((long)local_98 + uVar15) = (char)local_58[0];
      if (cVar4 == '\0') {
        (s->sh).luma_weight_l1[uVar15] = (RK_S16)(1 << ((s->sh).luma_log2_weight_denom & 0x1f));
        (s->sh).luma_offset_l1[uVar15] = 0;
      }
      uVar15 = uVar15 + 1;
      uVar12 = (ulong)(s->sh).nb_refs[1];
    } while (uVar15 < uVar12);
    pHVar10 = s->sps;
    if (pHVar10->chroma_format_idc == 0) {
      if (uVar12 != 0) {
        memset(local_58,0,uVar12);
LAB_0019f903:
        local_80 = (s->sh).chroma_weight_l1;
        local_88 = (s->sh).chroma_offset_l1;
        local_a0 = (HEVCSPS *)0x0;
        do {
          pHVar16 = local_a0;
          if (*(char *)((long)local_98 + (long)local_a0) != '\0') {
            MVar7 = mpp_read_ue(gb,&local_a4);
            pHVar16 = local_a0;
            pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
            gb->ret = MVar7;
            if (MVar7 != MPP_OK) break;
            (s->sh).luma_weight_l1[(long)local_a0] =
                 (short)(1 << ((s->sh).luma_log2_weight_denom & 0x1f)) + (short)local_a4;
            MVar7 = mpp_read_se(gb,(RK_S32 *)&local_a4);
            pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
            gb->ret = MVar7;
            if (MVar7 != MPP_OK) break;
            (s->sh).luma_offset_l1[(long)pHVar16] = (RK_S16)local_a4;
          }
          if (*(char *)((long)local_58 + (long)pHVar16) == '\0') {
            RVar6 = (RK_S16)(1 << ((byte)(s->sh).chroma_log2_weight_denom & 0x1f));
            (s->sh).chroma_weight_l1[(long)pHVar16][0] = RVar6;
            (s->sh).chroma_offset_l1[(long)pHVar16] = (RK_S16  [2])0x0;
            (s->sh).chroma_weight_l1[(long)pHVar16][1] = RVar6;
          }
          else {
            local_70 = local_80 + (long)pHVar16;
            local_78 = local_88 + (long)pHVar16;
            lVar13 = 0;
            bVar5 = true;
            do {
              bVar14 = bVar5;
              MVar7 = mpp_read_se(gb,(RK_S32 *)&local_a4);
              RVar2 = local_a4;
              pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
              gb->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_0019f55c;
              MVar7 = mpp_read_se(gb,(RK_S32 *)&local_a4);
              pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
              gb->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_0019f55c;
              bVar1 = (byte)(s->sh).chroma_log2_weight_denom;
              sVar11 = (short)(1 << (bVar1 & 0x1f)) + (short)RVar2;
              (*local_70)[lVar13] = sVar11;
              uVar9 = local_a4 - (((int)sVar11 << 7) >> (bVar1 & 0x1f));
              if (-2 < (int)uVar9) {
                uVar9 = 0xffffffff;
              }
              if (uVar9 < 0xffffff01) {
                uVar9 = 0xffffff00;
              }
              (*local_78)[lVar13] = (short)uVar9 + 0x80;
              lVar13 = 1;
              bVar5 = false;
            } while (bVar14);
          }
          local_a0 = (HEVCSPS *)((long)&local_a0->vps_id + 1);
          pHVar10 = (HEVCSPS *)(ulong)(s->sh).nb_refs[1];
          if (pHVar10 <= local_a0) break;
        } while( true );
      }
    }
    else if (uVar12 != 0) {
      pHVar16 = (HEVCSPS *)0x0;
      do {
        MVar7 = mpp_read_bits(gb,1,(RK_S32 *)&local_a4);
        pHVar10 = (HEVCSPS *)(ulong)(uint)MVar7;
        gb->ret = MVar7;
        if (MVar7 != MPP_OK) goto LAB_0019f55c;
        *(undefined1 *)((long)local_58 + (long)pHVar16) = (undefined1)local_a4;
        pHVar16 = (HEVCSPS *)((long)&pHVar16->vps_id + 1);
        uVar9 = (s->sh).nb_refs[1];
        pHVar10 = (HEVCSPS *)(ulong)uVar9;
      } while (pHVar16 < pHVar10);
      if (uVar9 != 0) goto LAB_0019f903;
    }
  }
LAB_0019f55c:
  return (RK_S32)pHVar10;
}

Assistant:

static MPP_RET pred_weight_table(H264_SLICE_t *currSlice)
{
    RK_S32 se_tmp = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 i = 0, j = 0, temp = 0;
    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;

    READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    if (currSlice->active_sps->chroma_format_idc) {
        READ_UE(p_bitctx, &temp); //!< log2_weight_denom
    }
    for (i = 0; i < currSlice->num_ref_idx_active[LIST_0]; i++) {
        READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l0
        if (temp) {
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][0]
            READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][0]
        }
        if (currSlice->active_sps->chroma_format_idc) {
            READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l0
            for (j = 1; j < 3; j++) {
                if (temp) { //!< chroma_weight_flag_l0
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_0][i][j]
                    READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_0][i][j]
                }
            }
        }
    }

    if ((currSlice->slice_type == H264_B_SLICE) && currSlice->p_Vid->active_pps->weighted_bipred_idc == 1) {
        for (i = 0; i < currSlice->num_ref_idx_active[LIST_1]; i++) {
            READ_ONEBIT(p_bitctx, &temp); //!< luma_weight_flag_l1
            if (temp) {
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][0]
                READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][0]
            }
            if (currSlice->active_sps->chroma_format_idc) {
                READ_ONEBIT(p_bitctx, &temp); //!< chroma_weight_flag_l1
                for (j = 1; j < 3; j++) {
                    if (temp) { // chroma_weight_flag_l1
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_weight[LIST_1][i][j]
                        READ_SE(p_bitctx, &se_tmp); //!< slice->wp_offset[LIST_1][i][j]
                    }
                }
            }
        }
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    return ret = p_bitctx->ret;
}